

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_edison_fab_c.c
# Opt level: O1

mraa_result_t mraa_intel_edison_mmap_write(mraa_gpio_context dev,int value)

{
  uint uVar1;
  uint uVar2;
  uint8_t *puVar3;
  
  uVar1 = dev->pin;
  uVar2 = uVar1 + 0x1f;
  if (-1 < (int)uVar1) {
    uVar2 = uVar1;
  }
  puVar3 = mmap_reg + 0x4c;
  if (value != 0) {
    puVar3 = mmap_reg + 0x34;
  }
  *(int *)(puVar3 + (uVar2 >> 3 & 0xfc)) = 1 << ((byte)uVar1 & 0x1f);
  return MRAA_SUCCESS;
}

Assistant:

mraa_result_t
mraa_intel_edison_mmap_write(mraa_gpio_context dev, int value)
{
    uint8_t offset = ((dev->pin / 32) * sizeof(uint32_t));
    uint8_t valoff;

    if (value) {
        valoff = 0x34;
    } else {
        valoff = 0x4c;
    }

    *(volatile uint32_t*) (mmap_reg + offset + valoff) = (uint32_t)(1 << (dev->pin % 32));

    return MRAA_SUCCESS;
}